

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int update_path_and_do(c2m_ctx_t c2m_ctx,int go_inside_p,
                      _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *action,size_t mark,
                      node_t_conflict value,int const_only_p,mir_llong *max_index,pos_t pos,
                      char *detail)

{
  undefined4 uVar1;
  type_mode tVar2;
  byte *pbVar3;
  long lVar4;
  VARR_node_t *pVVar5;
  bool bVar6;
  int iVar7;
  node_t_conflict pnVar8;
  node_t pnVar9;
  void *pvVar10;
  ulong uVar11;
  node_t_conflict *ppnVar12;
  init_object_t *piVar13;
  VARR_init_object_t *pVVar14;
  size_t sVar15;
  type **pptVar16;
  type *extraout_RDX;
  char *extraout_RDX_00;
  type *ptVar17;
  type *unaff_RBP;
  type_mode tVar18;
  undefined4 in_register_00000034;
  node_t_conflict pnVar19;
  decl_t pdVar20;
  anon_union_8_2_e4b0c9a5_for_u *paVar21;
  char *pcVar22;
  c2m_ctx_t pcVar23;
  c2m_ctx_t pcVar24;
  size_t unaff_R13;
  c2m_ctx_t type;
  bool bVar25;
  pos_t p;
  long local_78;
  type *local_68;
  undefined8 uStack_60;
  node_t_conflict local_58;
  _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *local_48;
  node_t_conflict local_40;
  c2m_ctx_t local_38;
  
  pnVar19 = (node_t_conflict)CONCAT44(in_register_00000034,go_inside_p);
  if (value->attr == (void *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = *(long *)((long)value->attr + 0x18);
  }
  if (go_inside_p == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = value->code != N_COMPOUND_LITERAL && value->code != N_LIST;
  }
  pVVar14 = c2m_ctx->init_object_path;
  pcVar24 = c2m_ctx;
  local_48 = action;
  local_40 = value;
  pcVar23 = c2m_ctx;
  if (pVVar14 != (VARR_init_object_t *)0x0) {
    while (local_38 = pcVar23, unaff_R13 = pVVar14->els_num, unaff_R13 != mark) {
      if ((unaff_R13 == 0) || (piVar13 = pVVar14->varr, piVar13 == (init_object_t *)0x0)) {
        update_path_and_do_cold_7();
LAB_0018a519:
        update_path_and_do_cold_1();
LAB_0018a51e:
        update_path_and_do_cold_2();
LAB_0018a523:
        update_path_and_do_cold_6();
LAB_0018a528:
        __assert_fail("el_type->mode == TM_ARR || el_type->mode == TM_STRUCT || el_type->mode == TM_UNION"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1cdd,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
      }
      unaff_RBP = piVar13[unaff_R13 - 1].container_type;
      tVar18 = piVar13[unaff_R13 - 1].field_designator_p;
      uVar1 = *(undefined4 *)&piVar13[unaff_R13 - 1].field_0xc;
      pcVar23 = (c2m_ctx_t)piVar13[unaff_R13 - 1].u.curr_member;
      tVar2 = unaff_RBP->mode;
      pnVar19 = (node_t_conflict)(ulong)tVar2;
      c2m_ctx = (c2m_ctx_t)(ulong)(tVar2 - TM_STRUCT);
      if (tVar2 - TM_STRUCT < 2) {
        if (pcVar23 == (c2m_ctx_t)0x0) {
          pnVar9 = (((unaff_RBP->u).tag_type)->u).ops.head;
          if (pnVar9 != (node_t)0x0) {
            pnVar9 = (pnVar9->op_link).next;
          }
          if ((pnVar9 == (node_t)0x0) || (pnVar9->code != N_LIST)) goto LAB_0018a54c;
          for (pnVar8 = (pnVar9->u).ops.head; pnVar8 != (node_t_conflict)0x0;
              pnVar8 = (pnVar8->op_link).next) {
            if (pnVar8->code == N_MEMBER) {
              pnVar9 = (pnVar8->u).ops.head;
              if (pnVar9 != (node_t)0x0) {
                pnVar9 = (pnVar9->op_link).next;
              }
              if ((pnVar9->code != N_IGNORE) ||
                 ((pnVar8->attr != (void *)0x0 &&
                  (*(char *)(*(long *)((long)pnVar8->attr + 0x40) + 0x1d) != '\0')))) break;
            }
          }
        }
        else {
          tVar18 = tVar2 ^ TM_UNION | tVar18;
          pnVar19 = (node_t_conflict)(ulong)tVar18;
          if (tVar18 == TM_UNDEF) {
            pnVar8 = (node_t_conflict)0x0;
          }
          else {
            pnVar19 = (node_t_conflict)&DAT_00000001;
            pnVar8 = get_adjacent_member((node_t_conflict)pcVar23,1);
            c2m_ctx = pcVar23;
          }
        }
        if (pnVar8 == (node_t_conflict)0x0) {
          pVVar14 = pcVar24->init_object_path;
          if (((pVVar14 != (VARR_init_object_t *)0x0) && (pVVar14->varr != (init_object_t *)0x0)) &&
             (unaff_R13 = pVVar14->els_num, unaff_R13 != 0)) goto LAB_0018a388;
          goto LAB_0018a519;
        }
        type = *(c2m_ctx_t *)((long)pnVar8->attr + 0x40);
        tVar18 = TM_UNDEF;
LAB_0018a217:
        pVVar14 = pcVar24->init_object_path;
        if (pVVar14 == (VARR_init_object_t *)0x0) goto LAB_0018a523;
        piVar13 = pVVar14->varr;
        if ((piVar13 == (init_object_t *)0x0) || (sVar15 = pVVar14->els_num, sVar15 == 0))
        goto LAB_0018a51e;
        pnVar19 = (node_t_conflict)(sVar15 * 3);
        piVar13[sVar15 - 1].container_type = unaff_RBP;
        piVar13[sVar15 - 1].field_designator_p = tVar18;
        *(undefined4 *)&piVar13[sVar15 - 1].field_0xc = uVar1;
        piVar13[sVar15 - 1].u.curr_member = pnVar8;
        if (((!bVar6) || (c2m_ctx = type, iVar7 = scalar_type_p((type *)type), iVar7 != 0)) ||
           ((iVar7 = (int)type->env[0].__jmpbuf[1], iVar7 == 1 &&
            ((int)type->env[0].__jmpbuf[4] == 1)))) goto LAB_0018a3a3;
        if (2 < iVar7 - 4U) goto LAB_0018a528;
        if (((local_78 != 0) && (iVar7 != 6)) &&
           (type->env[0].__jmpbuf[4] == *(size_t *)(local_78 + 0x30))) goto LAB_0018a3a3;
        unaff_RBP = (type *)pcVar24->init_object_path;
        c2m_ctx = *(c2m_ctx_t *)&unaff_RBP->antialias;
        if (c2m_ctx == (c2m_ctx_t)0x0) {
          update_path_and_do_cold_3();
LAB_0018a54c:
          __assert_fail("declaration_list != NULL && declaration_list->code == N_LIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1cc4,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)"
                       );
        }
        ptVar17 = (type *)((long)&unaff_RBP->pos_node->code + 1);
        if (unaff_RBP->arr_type < ptVar17) {
          ptVar17 = (type *)((long)&ptVar17->pos_node + ((ulong)ptVar17 >> 1));
          pnVar19 = (node_t_conflict)((long)ptVar17 * 0x18);
          pvVar10 = realloc(c2m_ctx,(size_t)pnVar19);
          *(void **)&unaff_RBP->antialias = pvVar10;
          unaff_RBP->arr_type = ptVar17;
          pcVar24 = local_38;
        }
        unaff_R13 = -(ulong)(iVar7 == 6);
        pnVar8 = unaff_RBP->pos_node;
        lVar4 = *(long *)&unaff_RBP->antialias;
        unaff_RBP->pos_node = (node_t_conflict)((long)&pnVar8->code + 1);
        *(c2m_ctx_t *)(lVar4 + (long)pnVar8 * 0x18) = type;
        *(undefined4 *)(lVar4 + (long)pnVar8 * 0x18 + 8) = 0;
        *(undefined4 *)(lVar4 + (long)pnVar8 * 0x18 + 0xc) = uVar1;
        *(size_t *)(lVar4 + (long)pnVar8 * 0x18 + 0x10) = unaff_R13;
      }
      else {
        if (tVar2 != TM_ARR) {
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1cc0,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)"
                       );
        }
        c2m_ctx = (c2m_ctx_t)(unaff_RBP->u).tag_type;
        pnVar9 = (node_t)c2m_ctx->env[0].__jmpbuf[1];
        pnVar19 = (node_t_conflict)0xffffffffffffffff;
        if ((pnVar9->code != N_IGNORE) && (pbVar3 = (byte *)pnVar9->attr, (*pbVar3 & 1) != 0)) {
          iVar7 = *(int *)(*(long *)(pbVar3 + 0x18) + 0x18);
          if (iVar7 == 1) {
            bVar25 = *(int *)(*(long *)(pbVar3 + 0x18) + 0x30) - 2U < 0xc;
          }
          else {
            bVar25 = false;
          }
          if ((iVar7 == 2) || (bVar25)) {
            pnVar19 = *(node_t_conflict *)(pbVar3 + 0x30);
          }
        }
        type = (c2m_ctx_t)c2m_ctx->options;
        pnVar8 = (node_t_conflict)((long)&pcVar23->ctx + 1);
        if (((long)pnVar19 < 0) || ((long)pnVar8 < (long)pnVar19)) goto LAB_0018a217;
LAB_0018a388:
        unaff_R13 = unaff_R13 - 1;
        pVVar14->els_num = unaff_R13;
      }
      pVVar14 = pcVar24->init_object_path;
      pcVar23 = local_38;
      if (pVVar14 == (VARR_init_object_t *)0x0) goto LAB_0018a39e;
    }
LAB_0018a3aa:
    error(pcVar24,0x1c1444,pos.fname,pos._8_8_,detail);
    return 0;
  }
LAB_0018a39e:
  update_path_and_do_cold_8();
LAB_0018a3a3:
  pnVar8 = local_40;
  if (unaff_R13 == mark) goto LAB_0018a3aa;
  if (go_inside_p == 0) {
    return 1;
  }
  pVVar14 = pcVar24->init_object_path;
  if (((pVVar14 == (VARR_init_object_t *)0x0) ||
      (piVar13 = pVVar14->varr, piVar13 == (init_object_t *)0x0)) ||
     (sVar15 = pVVar14->els_num, sVar15 == 0)) {
    update_path_and_do_cold_5();
  }
  else {
    local_58 = piVar13[sVar15 - 1].u.curr_member;
    local_68 = piVar13[sVar15 - 1].container_type;
    uStack_60 = *(undefined8 *)&piVar13[sVar15 - 1].field_designator_p;
    if (local_68->mode - TM_STRUCT < 2) {
      pdVar20 = (decl_t)local_58->attr;
      pptVar16 = &(pdVar20->decl_spec).type;
LAB_0018a487:
      c2m_ctx = pcVar24;
      (*local_48)(pcVar24,pdVar20,pptVar16,pnVar8,const_only_p,0);
    }
    else if (local_68->mode == TM_ARR) {
      ptVar17 = (local_68->u).ptr_type;
      iVar7 = init_compatible_string_p(local_40,ptVar17->arr_type);
      pptVar16 = &local_68;
      if (iVar7 == 0) {
        pptVar16 = &ptVar17->arr_type;
      }
      pdVar20 = (decl_t)0x0;
      goto LAB_0018a487;
    }
    if (max_index == (mir_llong *)0x0) {
      return 1;
    }
    pVVar14 = pcVar24->init_object_path;
    pnVar19 = (node_t_conflict)max_index;
    if (((pVVar14 != (VARR_init_object_t *)0x0) &&
        (piVar13 = pVVar14->varr, piVar13 != (init_object_t *)0x0)) && (mark < pVVar14->els_num)) {
      if ((piVar13[mark].container_type)->mode != TM_ARR) {
        return 1;
      }
      if (piVar13[mark].u.curr_index <= *max_index) {
        return 1;
      }
      *max_index = piVar13[mark].u.curr_index;
      return 1;
    }
  }
  update_path_and_do_cold_4();
  if (pnVar19->code == N_MEMBER) {
    pVVar14 = c2m_ctx->init_object_path;
    if (pVVar14 != (VARR_init_object_t *)0x0) {
      sVar15 = pVVar14->els_num;
      ptVar17 = extraout_RDX;
      if (sVar15 != 0) {
        paVar21 = &pVVar14->varr[sVar15 - 1].u;
        do {
          sVar15 = sVar15 - 1;
          if (pVVar14->varr == (init_object_t *)0x0) goto LAB_0018a812;
          unaff_RBP = (type *)(ulong)*(uint *)((long)paVar21 + -4);
          if (((*(int *)(paVar21 + -1) == 0) || (paVar21->curr_member->attr == (void *)0x0)) ||
             (*(char *)(*(long *)((long)paVar21->curr_member->attr + 0x40) + 0x1d) == '\0')) break;
          ptVar17 = ((init_object_t *)(paVar21 + -2))->container_type;
          pVVar14->els_num = sVar15;
          if (pVVar14 == (VARR_init_object_t *)0x0) goto LAB_0018a80d;
          paVar21 = paVar21 + -3;
        } while (sVar15 != 0);
      }
      if (c2m_ctx->containing_anon_members == (VARR_node_t *)0x0) {
        process_init_field_designator_cold_7();
LAB_0018a83b:
        __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)"
                     );
      }
      if (c2m_ctx->containing_anon_members->els_num != 0) goto LAB_0018a83b;
      pnVar8 = *(node_t_conflict *)((long)pnVar19->attr + 0x48);
      while (pnVar8 != (node_t_conflict)0x0) {
        pVVar5 = c2m_ctx->containing_anon_members;
        if (pVVar5->varr == (node_t_conflict *)0x0) goto LAB_0018a808;
        pvVar10 = pnVar8->attr;
        uVar11 = pVVar5->els_num + 1;
        if (pVVar5->size < uVar11) {
          unaff_RBP = (type *)((ulong)unaff_RBP & 0xffffffff);
          sVar15 = (uVar11 >> 1) + uVar11;
          ppnVar12 = (node_t_conflict *)realloc(pVVar5->varr,sVar15 * 8);
          pVVar5->varr = ppnVar12;
          pVVar5->size = sVar15;
        }
        sVar15 = pVVar5->els_num;
        pVVar5->els_num = sVar15 + 1;
        pVVar5->varr[sVar15] = pnVar8;
        pnVar8 = *(node_t_conflict *)((long)pvVar10 + 0x48);
      }
      while (pVVar5 = c2m_ctx->containing_anon_members, pVVar5 != (VARR_node_t *)0x0) {
        sVar15 = pVVar5->els_num;
        if (sVar15 == 0) {
          pcVar22 = (char *)0x0;
          pnVar19 = get_adjacent_member(pnVar19,0);
          pVVar14 = c2m_ctx->init_object_path;
          pcVar24 = (c2m_ctx_t)pVVar14->varr;
          if (pcVar24 == (c2m_ctx_t)0x0) {
            process_init_field_designator_cold_5();
            pnVar19 = new_node(pcVar24,N_L);
            p.lno = (int)sVar15;
            p.ln_pos = (int)(sVar15 >> 0x20);
            p.fname = extraout_RDX_00;
            add_pos(pcVar24,pnVar19,p);
            (pnVar19->u).s.s = pcVar22;
            return (int)pnVar19;
          }
          uVar11 = pVVar14->els_num + 1;
          if (pVVar14->size < uVar11) {
            sVar15 = (uVar11 >> 1) + uVar11;
            piVar13 = (init_object_t *)realloc(pcVar24,sVar15 * 0x18);
            pVVar14->varr = piVar13;
            pVVar14->size = sVar15;
          }
          sVar15 = pVVar14->els_num;
          piVar13 = pVVar14->varr;
          pVVar14->els_num = sVar15 + 1;
          piVar13[sVar15].container_type = ptVar17;
          piVar13[sVar15].field_designator_p = 1;
          *(int *)&piVar13[sVar15].field_0xc = (int)unaff_RBP;
          piVar13[sVar15].u.curr_member = pnVar19;
          return (int)sVar15 * 3;
        }
        if (pVVar5->varr == (node_t_conflict *)0x0) goto LAB_0018a7fe;
        pVVar5->els_num = sVar15 - 1;
        pVVar14 = c2m_ctx->init_object_path;
        if (pVVar14->varr == (init_object_t *)0x0) goto LAB_0018a803;
        pnVar8 = pVVar5->varr[sVar15 - 1];
        uVar11 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar11) {
          sVar15 = (uVar11 >> 1) + uVar11;
          piVar13 = (init_object_t *)realloc(pVVar14->varr,sVar15 * 0x18);
          pVVar14->varr = piVar13;
          pVVar14->size = sVar15;
        }
        sVar15 = pVVar14->els_num;
        piVar13 = pVVar14->varr;
        pVVar14->els_num = sVar15 + 1;
        piVar13[sVar15].container_type = ptVar17;
        piVar13[sVar15].field_designator_p = 0;
        *(int *)&piVar13[sVar15].field_0xc = (int)unaff_RBP;
        piVar13[sVar15].u.curr_member = pnVar8;
        ptVar17 = *(type **)((long)pnVar8->attr + 0x40);
      }
      process_init_field_designator_cold_6();
LAB_0018a7fe:
      process_init_field_designator_cold_4();
LAB_0018a803:
      process_init_field_designator_cold_3();
LAB_0018a808:
      process_init_field_designator_cold_2();
    }
LAB_0018a80d:
    process_init_field_designator_cold_8();
LAB_0018a812:
    process_init_field_designator_cold_1();
  }
  __assert_fail("designator_member->code == N_MEMBER",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
}

Assistant:

static int update_path_and_do (c2m_ctx_t c2m_ctx, int go_inside_p,
                               void (*action) (c2m_ctx_t c2m_ctx, decl_t member_decl,
                                               struct type **type_ptr, node_t initializer,
                                               int const_only_p, int top_p),
                               size_t mark, node_t value, int const_only_p, mir_llong *max_index,
                               pos_t pos, const char *detail) {
  init_object_t init_object;
  mir_llong index;
  struct type *el_type;
  struct expr *value_expr = value->attr;

  if (!update_init_object_path (c2m_ctx, mark, value_expr == NULL ? NULL : value_expr->type,
                                !go_inside_p || value->code == N_LIST
                                  || value->code == N_COMPOUND_LITERAL)) {
    error (c2m_ctx, pos, "excess elements in %s initializer", detail);
    return FALSE;
  }
  if (!go_inside_p) return TRUE;
  init_object = VARR_LAST (init_object_t, init_object_path);
  if (init_object.container_type->mode == TM_ARR) {
    el_type = init_object.container_type->u.arr_type->el_type;
    action (c2m_ctx, NULL,
            (init_compatible_string_p (value, el_type)
               ? &init_object.container_type
               : &init_object.container_type->u.arr_type->el_type),
            value, const_only_p, FALSE);
  } else if (init_object.container_type->mode == TM_STRUCT
             || init_object.container_type->mode == TM_UNION) {
    action (c2m_ctx, (decl_t) init_object.u.curr_member->attr,
            &((decl_t) init_object.u.curr_member->attr)->decl_spec.type, value, const_only_p,
            FALSE);
  }
  if (max_index != NULL) {
    init_object = VARR_GET (init_object_t, init_object_path, mark);
    if (init_object.container_type->mode == TM_ARR
        && *max_index < (index = init_object.u.curr_index))
      *max_index = index;
  }
  return TRUE;
}